

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Port::assign_(Port *this,shared_ptr<kratos::Var> *var,AssignmentType type)

{
  initializer_list<kratos::IRNode_*> __l;
  bool bVar1;
  VarType VVar2;
  PortType PVar3;
  UserException *this_00;
  element_type *peVar4;
  element_type *this_01;
  StmtException *this_02;
  undefined4 in_register_00000014;
  remove_reference_t<std::__cxx11::basic_string<char>_> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::AssignStmt> sVar5;
  format_args args;
  string_view format_str;
  allocator<kratos::IRNode_*> local_1b9;
  IRNode *local_1b8;
  element_type *local_1b0;
  iterator local_1a8;
  size_type local_1a0;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_198;
  remove_reference_t<std::__cxx11::basic_string<char>_> local_180;
  char local_160 [32];
  string local_140;
  VarCastType local_11c;
  undefined1 local_118 [4];
  VarCastType cast_type;
  shared_ptr<kratos::VarCasted> casted;
  bool allowed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  element_type *peStack_b0;
  AssignmentType type_local;
  shared_ptr<kratos::Var> *var_local;
  Port *this_local;
  undefined1 local_98 [16];
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [57];
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  __node_base local_10;
  
  peStack_b0 = (element_type *)CONCAT44(in_register_00000014,type);
  var_local = var;
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)peStack_b0);
  if (!bVar1) {
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
         = 1;
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sinks_).
              _M_h._M_buckets)(&local_f8);
    std::operator+(&local_d8,"Trying to assign null to ",&local_f8);
    UserException::UserException(this_00,&local_d8);
    casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_
         = 0;
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peStack_b0);
  VVar2 = Var::type(peVar4);
  if (VVar2 != PortIO) {
    peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)peStack_b0);
    VVar2 = Var::type(peVar4);
    if (VVar2 != ConstValue) {
      PVar3 = port_type((Port *)var);
      casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _2_1_ = PVar3 == Data;
      peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)peStack_b0);
      VVar2 = Var::type(peVar4);
      if (VVar2 == BaseCasted) {
        std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   peStack_b0);
        Var::as<kratos::VarCasted>((Var *)local_118);
        this_01 = std::
                  __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_118);
        local_11c = VarCasted::cast_type(this_01);
        if ((local_11c == AsyncReset) && (PVar3 = port_type((Port *)var), PVar3 == AsyncReset)) {
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._2_1_ = 1;
        }
        if ((local_11c == Reset) && (PVar3 = port_type((Port *)var), PVar3 == Reset)) {
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._2_1_ = 1;
        }
        else if ((local_11c == Clock) && (PVar3 = port_type((Port *)var), PVar3 == Clock)) {
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._2_1_ = 1;
        }
        else if ((local_11c == ClockEnable) &&
                (PVar3 = port_type((Port *)var), PVar3 == ClockEnable)) {
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._2_1_ = 1;
        }
        std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_118);
      }
      if ((casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi._2_1_ & 1) == 0) {
        this_02 = (StmtException *)__cxa_allocate_exception(0x10);
        peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peStack_b0);
        (*(peVar4->super_IRNode)._vptr_IRNode[0x1f])(local_160);
        (*(code *)(((var->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  sinks_)._M_h._M_buckets)(&local_180);
        local_38 = &local_140;
        local_40 = "Typing error. Cannot assign variable ({0}) to port ({1})";
        local_48 = (char (*) [57])local_160;
        vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_180;
        fmt::v7::make_args_checked<std::__cxx11::string,std::__cxx11::string,char[57],char>
                  (&local_78,(v7 *)"Typing error. Cannot assign variable ({0}) to port ({1})",
                   local_48,(remove_reference_t<std::__cxx11::basic_string<char>_> *)vargs,in_R8);
        local_58 = &local_78;
        local_88 = fmt::v7::to_string_view<char,_0>(local_40);
        local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)local_98;
        local_30 = local_58;
        local_20 = local_58;
        local_10._M_nxt = (_Hash_node_base *)local_58;
        local_18 = local_28;
        fmt::v7::
        basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        ::basic_format_args(local_28,0xdd,
                            (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                             *)local_58);
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.values_ = in_R9.values_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = local_98._8_8_;
        format_str.size_ = local_98._0_8_;
        format_str.data_ = (char *)local_88.size_;
        fmt::v7::detail::vformat_abi_cxx11_(&local_140,(detail *)local_88.data_,format_str,args);
        local_1b8 = (IRNode *)var;
        local_1b0 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)peStack_b0);
        local_1a8 = &local_1b8;
        local_1a0 = 2;
        std::allocator<kratos::IRNode_*>::allocator(&local_1b9);
        __l._M_len = local_1a0;
        __l._M_array = local_1a8;
        std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                  (&local_198,__l,&local_1b9);
        StmtException::StmtException(this_02,&local_140,&local_198);
        __cxa_throw(this_02,&StmtException::typeinfo,StmtException::~StmtException);
      }
    }
  }
  sVar5 = Var::assign_(&this->super_Var,var,(AssignmentType)peStack_b0);
  sVar5.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar5.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Port::assign_(const std::shared_ptr<Var>& var,
                                          enum kratos::AssignmentType type) {
    if (!var) {
        throw UserException("Trying to assign null to " + to_string());
    }
    // notice that we have the following rules
    // var <- port. this is considered as a lower cast, hence it's allowed
    // port <- var. this is considered as an upper cast, which needs explicit casting
    if (var->type() != VarType::PortIO && var->type() != VarType::ConstValue) {
        bool allowed = port_type() == PortType::Data;
        if (var->type() == VarType::BaseCasted) {
            auto casted = var->as<VarCasted>();
            auto cast_type = casted->cast_type();
            if (cast_type == VarCastType::AsyncReset && port_type() == PortType::AsyncReset)
                allowed = true;  // NOLINT
            if (cast_type == VarCastType::Reset && port_type() == PortType::Reset)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::Clock && port_type() == PortType::Clock)
                allowed = true;  // NOLINT
            else if (cast_type == VarCastType::ClockEnable && port_type() == PortType::ClockEnable)
                allowed = true;  // NOLINT
        }
        if (!allowed) {
            throw StmtException(::format("Typing error. Cannot assign variable ({0}) to port ({1})",
                                         var->to_string(), to_string()),
                                {this, var.get()});
        }
    }
    return Var::assign_(var, type);
}